

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Music_Emu.cpp
# Opt level: O2

blargg_err_t __thiscall Music_Emu::skip_(Music_Emu *this,long count)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar3;
  
  if (30000 < count) {
    uVar1 = this->mute_mask_;
    this->mute_mask_ = -1;
    (*(this->super_Gme_File)._vptr_Gme_File[0xd])(this,0xffffffffffffffff);
    while ((15000 < count && (this->emu_track_ended_ == false))) {
      iVar2 = (*(this->super_Gme_File)._vptr_Gme_File[0x10])(this,0x800,(this->buf).begin_);
      if ((blargg_err_t)CONCAT44(extraout_var,iVar2) != (blargg_err_t)0x0) {
        return (blargg_err_t)CONCAT44(extraout_var,iVar2);
      }
      count = count + -0x800;
    }
    this->mute_mask_ = uVar1;
    (*(this->super_Gme_File)._vptr_Gme_File[0xd])(this,(ulong)uVar1);
  }
  while( true ) {
    if (count == 0) {
      return (blargg_err_t)0x0;
    }
    if (this->emu_track_ended_ != false) break;
    lVar3 = 0x800;
    if (count < 0x800) {
      lVar3 = count;
    }
    count = count - lVar3;
    iVar2 = (*(this->super_Gme_File)._vptr_Gme_File[0x10])(this,lVar3,(this->buf).begin_);
    if ((blargg_err_t)CONCAT44(extraout_var_00,iVar2) != (blargg_err_t)0x0) {
      return (blargg_err_t)CONCAT44(extraout_var_00,iVar2);
    }
  }
  return (blargg_err_t)0x0;
}

Assistant:

blargg_err_t Music_Emu::skip_( long count )
{
	// for long skip, mute sound
	const long threshold = 30000;
	if ( count > threshold )
	{
		int saved_mute = mute_mask_;
		mute_voices( ~0 );
		
		while ( count > threshold / 2 && !emu_track_ended_ )
		{
			RETURN_ERR( play_( buf_size, buf.begin() ) );
			count -= buf_size;
		}
		
		mute_voices( saved_mute );
	}
	
	while ( count && !emu_track_ended_ )
	{
		long n = buf_size;
		if ( n > count )
			n = count;
		count -= n;
		RETURN_ERR( play_( n, buf.begin() ) );
	}
	return 0;
}